

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O3

Ssh_gss_stat ssh_gssapi_acquire_cred(ssh_gss_library *lib,Ssh_gss_ctx *ctx,time_t *expiry)

{
  long *plVar1;
  OM_uint32 OVar2;
  OM_uint32 *ptr;
  time_t tVar3;
  long lVar4;
  OM_uint32 time_rec;
  gss_cred_id_t cred;
  long *local_50;
  OM_uint32 dummy;
  gss_OID_set_desc k5only;
  
  k5only.count = 1;
  k5only.elements = &gss_mech_krb5_desc;
  local_50 = expiry;
  ptr = (OM_uint32 *)safemalloc(1,0x18,0);
  ptr[2] = 0;
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  OVar2 = (*(lib->u).gssapi.acquire_cred)
                    (ptr + 1,(gss_name_t)0x0,0xffffffff,&k5only,1,&cred,(gss_OID_set *)0x0,&time_rec
                    );
  plVar1 = local_50;
  *ptr = OVar2;
  if (OVar2 == 0) {
    if (time_rec + 1 < 2) {
      OVar2 = (*(lib->u).gssapi.inquire_cred_by_mech)
                        (ptr + 1,cred,&gss_mech_krb5_desc,(gss_name_t *)0x0,&time_rec,
                         (OM_uint32 *)0x0,(gss_cred_usage_t *)0x0);
      *ptr = OVar2;
    }
    (*(lib->u).gssapi.release_cred)(&dummy,&cred);
    if (*ptr == 0) {
      if (time_rec == 0xffffffff) {
        lVar4 = -1;
      }
      else {
        tVar3 = time((time_t *)0x0);
        lVar4 = (ulong)time_rec + tVar3;
      }
      *(long *)(ptr + 4) = lVar4;
      if (plVar1 != (long *)0x0) {
        *plVar1 = lVar4;
      }
      *ctx = ptr;
      return SSH_GSS_OK;
    }
  }
  safefree(ptr);
  return SSH_GSS_FAILURE;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_acquire_cred(struct ssh_gss_library *lib,
                                            Ssh_gss_ctx *ctx,
                                            time_t *expiry)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    gss_OID_set_desc k5only = { 1, GSS_MECH_KRB5 };
    gss_cred_id_t cred;
    OM_uint32 dummy;
    OM_uint32 time_rec;
    gssapi_ssh_gss_ctx *gssctx = snew(gssapi_ssh_gss_ctx);

    gssctx->ctx = GSS_C_NO_CONTEXT;
    gssctx->expiry = 0;

    gssctx->maj_stat =
        gss->acquire_cred(&gssctx->min_stat, GSS_C_NO_NAME, GSS_C_INDEFINITE,
                          &k5only, GSS_C_INITIATE, &cred,
                          (gss_OID_set *)0, &time_rec);

    if (gssctx->maj_stat != GSS_S_COMPLETE) {
        sfree(gssctx);
        return SSH_GSS_FAILURE;
    }

    /*
     * When the credential lifetime is not yet available due to deferred
     * processing, gss_acquire_cred should return a 0 lifetime which is
     * distinct from GSS_C_INDEFINITE which signals a crential that never
     * expires.  However, not all implementations get this right, and with
     * Kerberos, initiator credentials always expire at some point.  So when
     * lifetime is 0 or GSS_C_INDEFINITE we call gss_inquire_cred_by_mech() to
     * complete deferred processing.
     */
    if (time_rec == GSS_C_INDEFINITE || time_rec == 0) {
        gssctx->maj_stat =
            gss->inquire_cred_by_mech(&gssctx->min_stat, cred,
                                      (gss_OID) GSS_MECH_KRB5,
                                      GSS_C_NO_NAME,
                                      &time_rec,
                                      NULL,
                                      NULL);
    }
    (void) gss->release_cred(&dummy, &cred);

    if (gssctx->maj_stat != GSS_S_COMPLETE) {
        sfree(gssctx);
        return SSH_GSS_FAILURE;
    }

    if (time_rec != GSS_C_INDEFINITE)
        gssctx->expiry = time(NULL) + time_rec;
    else
        gssctx->expiry = GSS_NO_EXPIRATION;

    if (expiry) {
        *expiry = gssctx->expiry;
    }

    *ctx = (Ssh_gss_ctx) gssctx;
    return SSH_GSS_OK;
}